

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

ResponseOrProtocolError * __thiscall
kj::HttpHeaders::tryParseResponse
          (ResponseOrProtocolError *__return_storage_ptr__,HttpHeaders *this,ArrayPtr<char> content)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  byte *pbVar6;
  int iVar7;
  byte *local_60;
  ArrayPtr<const_char> local_58;
  char local_48;
  int *local_40;
  long local_38;
  
  uVar4 = content.size_;
  pbVar6 = (byte *)content.ptr;
  if ((uVar4 < 2) || (pbVar6[uVar4 - 1] != 10)) {
    __return_storage_ptr__->tag = 2;
    *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
    *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
         "Response headers have no terminal newline.";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2b;
    *(byte **)((long)&__return_storage_ptr__->field_1 + 0x28) = pbVar6;
    *(ulong *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar4;
    return __return_storage_ptr__;
  }
  lVar3 = uVar4 - 1;
  if (pbVar6[uVar4 - 2] == 0xd) {
    lVar3 = uVar4 - 2;
  }
  pbVar6[~(ulong)(pbVar6[uVar4 - 2] == 0xd) + uVar4] = 0;
  local_60 = pbVar6;
  consumeWord((char **)&local_60);
  if (local_48 == '\x01') {
    if ((local_38 - 1U < 5) || ((char)local_40[1] != '/' || *local_40 != 0x50545448)) {
      __return_storage_ptr__->tag = 2;
      *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
      *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
      *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
           "Invalid response status line (invalid protocol).";
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x31;
    }
    else {
      for (; (bVar1 = *local_60, bVar1 == 9 || (bVar1 == 0x20)); local_60 = local_60 + 1) {
      }
      if ((byte)(bVar1 - 0x30) < 10) {
        iVar7 = 0;
        do {
          iVar7 = (uint)bVar1 + iVar7 * 10 + -0x30;
          bVar1 = local_60[1];
          local_60 = local_60 + 1;
        } while ((byte)(bVar1 - 0x30) < 10);
        local_58 = (ArrayPtr<const_char>)consumeLine((char **)&local_60);
        bVar2 = parseHeaders(this,(char *)local_60,(char *)(pbVar6 + lVar3));
        if (bVar2) {
          __return_storage_ptr__->tag = 1;
          *(int *)&__return_storage_ptr__->field_1 = iVar7;
          lVar3 = 0x18;
          lVar5 = 0x10;
          goto LAB_0038cbc2;
        }
        __return_storage_ptr__->tag = 2;
        *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
        *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
        *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
             "The headers sent by the server are not valid.";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2e;
      }
      else {
        __return_storage_ptr__->tag = 2;
        *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
        *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
        *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
             "Invalid response status line (invalid status code).";
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x34;
      }
    }
  }
  else {
    __return_storage_ptr__->tag = 2;
    *(undefined4 *)&__return_storage_ptr__->field_1 = 0x1f6;
    *(char **)((long)&__return_storage_ptr__->field_1 + 8) = "Bad Gateway";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0xc;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x18) =
         "Invalid response status line (no spaces).";
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x2a;
  }
  lVar3 = 0x38;
  lVar5 = 0x30;
  local_58.size_ = uVar4;
  local_58.ptr = (char *)pbVar6;
LAB_0038cbc2:
  *(char **)((long)&__return_storage_ptr__->tag + lVar5) = local_58.ptr;
  *(size_t *)((long)&__return_storage_ptr__->tag + lVar3) = local_58.size_;
  return __return_storage_ptr__;
}

Assistant:

HttpHeaders::ResponseOrProtocolError HttpHeaders::tryParseResponse(kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) {
    return ProtocolError { 502, "Bad Gateway",
        "Response headers have no terminal newline.", content };
  }

  char* ptr = content.begin();

  HttpHeaders::Response response;

  KJ_IF_SOME(version, consumeWord(ptr)) {
    if (!version.startsWith("HTTP/")) {
      return ProtocolError { 502, "Bad Gateway",
          "Invalid response status line (invalid protocol).", content };
    }
  } else {
    return ProtocolError { 502, "Bad Gateway",
        "Invalid response status line (no spaces).", content };
  }